

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> * __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,
          vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *other)

{
  ulong uVar1;
  ulong uVar2;
  
  if (this != other) {
    this->nStored = 0;
    reserve(this,other->nStored);
    uVar2 = other->nStored;
    if (uVar2 != 0) {
      uVar1 = 0;
      do {
        this->ptr[uVar1] = other->ptr[uVar1];
        uVar1 = uVar1 + 1;
        uVar2 = other->nStored;
      } while (uVar1 < uVar2);
    }
    this->nStored = uVar2;
  }
  return this;
}

Assistant:

vector &operator=(const vector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();

        return *this;
    }